

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PP_FDTD_1D.cpp
# Opt level: O1

void __thiscall PP_FDTD_1D::PP_FDTD_1D(PP_FDTD_1D *this,PP_FDTD_1D *other)

{
  this->_vptr_PP_FDTD_1D = (_func_int **)&PTR__PP_FDTD_1D_00116cc8;
  PP_smartAlloc::PP_smartAlloc(&this->myAllocator);
  this->dt = other->dt;
  this->DT = other->DT;
  this->dz = other->dz;
  this->DZ = other->DZ;
  this->R = other->R;
  this->L = other->L;
  this->C = other->C;
  this->G = other->G;
  this->Nt = other->Nt;
  this->Nz = other->Nz;
  return;
}

Assistant:

PP_FDTD_1D::PP_FDTD_1D(PP_FDTD_1D const &other)
{
    this->dt = other.dt;
    this->DT = other.DT;
    this->dz = other.dz;
    this->DZ = other.DZ;
    this->R = other.R;
    this->L = other.L;
    this->C = other.C;
    this->G = other.G;
    this->Nt = other.Nt;
    this->Nz = other.Nz;

    //copy initial conditions


}